

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polish.c
# Opt level: O1

c_int polish(OSQPWorkspace *work)

{
  double dVar1;
  double dVar2;
  OSQPPolish *pOVar3;
  OSQPData *pOVar4;
  c_int *pcVar5;
  csc *pcVar6;
  c_int *pcVar7;
  c_int *pcVar8;
  c_int *pcVar9;
  OSQPInfo *pOVar10;
  LinSysSolver *pLVar11;
  csc *pcVar12;
  c_int cVar13;
  c_float *pcVar14;
  c_float *pcVar15;
  c_float *pcVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  c_float cVar22;
  LinSysSolver *plsh;
  LinSysSolver *local_38;
  
  osqp_tic(work->timer);
  pOVar3 = work->pol;
  pOVar3->n_low = 0;
  pOVar3->n_upp = 0;
  pOVar4 = work->data;
  if (0 < pOVar4->m) {
    pcVar14 = work->y;
    pcVar15 = work->z;
    pcVar16 = pOVar4->l;
    pcVar5 = pOVar3->A_to_Alow;
    lVar20 = 0;
    do {
      lVar21 = -1;
      if (pcVar15[lVar20] - pcVar16[lVar20] < -pcVar14[lVar20]) {
        pOVar3->Alow_to_A[pOVar3->n_low] = lVar20;
        lVar21 = pOVar3->n_low;
        pOVar3->n_low = lVar21 + 1;
      }
      pcVar5[lVar20] = lVar21;
      lVar20 = lVar20 + 1;
    } while (lVar20 < pOVar4->m);
  }
  if (0 < pOVar4->m) {
    pcVar14 = pOVar4->u;
    pcVar15 = work->y;
    pcVar16 = work->z;
    pcVar5 = pOVar3->A_to_Aupp;
    lVar20 = 0;
    do {
      lVar21 = -1;
      if (pcVar14[lVar20] - pcVar16[lVar20] < pcVar15[lVar20]) {
        pOVar3->Aupp_to_A[pOVar3->n_upp] = lVar20;
        lVar21 = pOVar3->n_upp;
        pOVar3->n_upp = lVar21 + 1;
      }
      pcVar5[lVar20] = lVar21;
      lVar20 = lVar20 + 1;
    } while (lVar20 < pOVar4->m);
  }
  lVar20 = pOVar3->n_upp + pOVar3->n_low;
  if (lVar20 == 0) {
    pcVar12 = csc_spalloc(0,pOVar4->n,0,1,0);
    work->pol->Ared = pcVar12;
    if (pcVar12 == (csc *)0x0) {
LAB_001afc9a:
      lVar20 = -1;
    }
    else {
      lVar20 = 0;
      int_vec_set_scalar(pcVar12->p,0,work->data->n + 1);
    }
  }
  else {
    pcVar12 = pOVar4->A;
    if (pcVar12->p[pcVar12->n] < 1) {
      cVar13 = 0;
    }
    else {
      cVar13 = 0;
      lVar21 = 0;
      do {
        if ((pOVar3->A_to_Alow[pcVar12->i[lVar21]] != -1) ||
           (pOVar3->A_to_Aupp[pcVar12->i[lVar21]] != -1)) {
          cVar13 = cVar13 + 1;
        }
        lVar21 = lVar21 + 1;
      } while (pcVar12->p[pcVar12->n] != lVar21);
    }
    pcVar12 = csc_spalloc(lVar20,pOVar4->n,cVar13,1,0);
    pOVar3 = work->pol;
    pOVar3->Ared = pcVar12;
    if (pcVar12 == (csc *)0x0) goto LAB_001afc9a;
    pOVar4 = work->data;
    lVar20 = pOVar4->n;
    if (lVar20 < 1) {
      cVar13 = 0;
    }
    else {
      pcVar5 = pcVar12->p;
      pcVar6 = pOVar4->A;
      pcVar7 = pcVar6->p;
      cVar13 = 0;
      lVar21 = 0;
      do {
        pcVar5[lVar21] = cVar13;
        lVar20 = pcVar7[lVar21];
        lVar17 = lVar21 + 1;
        if (lVar20 < pcVar7[lVar21 + 1]) {
          pcVar8 = pOVar3->A_to_Alow;
          pcVar9 = pcVar6->i;
          do {
            lVar21 = pcVar8[pcVar9[lVar20]];
            if (lVar21 == -1) {
              if (pOVar3->A_to_Aupp[pcVar9[lVar20]] != -1) {
                lVar21 = pOVar3->A_to_Aupp[pcVar9[lVar20]] + pOVar3->n_low;
                goto LAB_001afc67;
              }
            }
            else {
LAB_001afc67:
              pcVar12->i[cVar13] = lVar21;
              pcVar12->x[cVar13] = pcVar6->x[lVar20];
              cVar13 = cVar13 + 1;
            }
            lVar20 = lVar20 + 1;
          } while (lVar20 < pcVar7[lVar17]);
        }
        lVar20 = pOVar4->n;
        lVar21 = lVar17;
      } while (lVar17 < lVar20);
    }
    pcVar12->p[lVar20] = cVar13;
    lVar20 = pOVar3->n_upp + pOVar3->n_low;
  }
  if (lVar20 < 0) {
    work->info->status_polish = -1;
  }
  else {
    cVar13 = init_linsys_solver(&local_38,work->data->P,work->pol->Ared,work->settings->delta,
                                (c_float *)0x0,work->settings->linsys_solver,1);
    if (cVar13 != 0) {
      work->info->status_polish = -1;
      pcVar12 = work->pol->Ared;
      if (pcVar12 == (csc *)0x0) {
        return 1;
      }
      csc_spfree(pcVar12);
      return 1;
    }
    pOVar4 = work->data;
    lVar21 = pOVar4->n;
    pcVar14 = (c_float *)malloc((lVar20 + lVar21) * 8);
    if (pcVar14 == (c_float *)0x0) {
      work->info->status_polish = -1;
      csc_spfree(work->pol->Ared);
    }
    else {
      if (0 < lVar21) {
        pcVar15 = pOVar4->q;
        lVar17 = 0;
        do {
          pcVar14[lVar17] = -pcVar15[lVar17];
          lVar17 = lVar17 + 1;
        } while (lVar21 != lVar17);
      }
      pOVar3 = work->pol;
      lVar17 = pOVar3->n_low;
      if (0 < lVar17) {
        pcVar15 = pOVar4->l;
        pcVar5 = pOVar3->Alow_to_A;
        lVar19 = 0;
        do {
          pcVar14[lVar21 + lVar19] = pcVar15[pcVar5[lVar19]];
          lVar19 = lVar19 + 1;
        } while (lVar17 != lVar19);
      }
      lVar19 = pOVar3->n_upp;
      if (0 < lVar19) {
        pcVar15 = pOVar4->u;
        pcVar5 = pOVar3->Aupp_to_A;
        lVar18 = 0;
        do {
          pcVar14[lVar21 + lVar17 + lVar18] = pcVar15[pcVar5[lVar18]];
          lVar18 = lVar18 + 1;
        } while (lVar19 != lVar18);
      }
      pcVar15 = vec_copy(pcVar14,lVar20 + lVar21);
      if (pcVar15 == (c_float *)0x0) {
        work->info->status_polish = -1;
        csc_spfree(work->pol->Ared);
      }
      else {
        (*local_38->solve)(local_38,pcVar15);
        pLVar11 = local_38;
        if (work->settings->polish_refine_iter < 1) {
LAB_001aff53:
          prea_vec_copy(pcVar15,work->pol->x,work->data->n);
          mat_vec(work->data->A,work->pol->x,work->pol->z,0);
          pOVar4 = work->data;
          pOVar3 = work->pol;
          lVar20 = pOVar3->n_low;
          if (pOVar3->n_upp + lVar20 == 0) {
            vec_set_scalar(pOVar3->y,0.0,pOVar4->m);
          }
          else {
            lVar21 = pOVar4->m;
            if (0 < lVar21) {
              lVar17 = pOVar4->n;
              pcVar5 = pOVar3->A_to_Alow;
              pcVar16 = pOVar3->y;
              lVar19 = 0;
              do {
                lVar18 = pcVar5[lVar19];
                if (lVar18 == -1) {
                  if (pOVar3->A_to_Aupp[lVar19] != -1) {
                    lVar18 = lVar20 + pOVar3->A_to_Aupp[lVar19];
                    goto LAB_001b0036;
                  }
                  cVar22 = 0.0;
                }
                else {
LAB_001b0036:
                  cVar22 = pcVar15[lVar17 + lVar18];
                }
                pcVar16[lVar19] = cVar22;
                lVar19 = lVar19 + 1;
              } while (lVar21 != lVar19);
            }
          }
          project_normalcone(work,work->pol->z,work->pol->y);
          update_info(work,0,1,1);
          pOVar3 = work->pol;
          pOVar10 = work->info;
          dVar1 = pOVar3->pri_res;
          dVar2 = pOVar10->pri_res;
          if (((dVar1 < dVar2) &&
              ((pOVar3->dua_res <= pOVar10->dua_res && pOVar10->dua_res != pOVar3->dua_res ||
               ((dVar1 < dVar2 && (pOVar10->dua_res <= 1e-10 && pOVar10->dua_res != 1e-10)))))) ||
             ((dVar2 < 1e-10 &&
              (pOVar3->dua_res <= pOVar10->dua_res && pOVar10->dua_res != pOVar3->dua_res)))) {
            pOVar10->obj_val = pOVar3->obj_val;
            pOVar10->pri_res = dVar1;
            pOVar10->dua_res = pOVar3->dua_res;
            pOVar10->status_polish = 1;
            prea_vec_copy(pOVar3->x,work->x,work->data->n);
            prea_vec_copy(work->pol->z,work->z,work->data->m);
            prea_vec_copy(work->pol->y,work->y,work->data->m);
            if (work->settings->verbose != 0) {
              print_polish(work);
            }
          }
          else {
            pOVar10->status_polish = -1;
          }
          (*local_38->free)(local_38);
          csc_spfree(work->pol->Ared);
          free(pcVar14);
          free(pcVar15);
          return 0;
        }
        lVar20 = work->pol->Ared->m + work->data->n;
        pcVar16 = (c_float *)malloc(lVar20 * 8);
        if (pcVar16 != (c_float *)0x0) {
          lVar21 = 0;
          do {
            prea_vec_copy(pcVar14,pcVar16,lVar20);
            mat_vec(work->data->P,pcVar15,pcVar16,-1);
            mat_tpose_vec(work->data->P,pcVar15,pcVar16,-1,1);
            mat_tpose_vec(work->pol->Ared,pcVar15 + work->data->n,pcVar16,-1,0);
            mat_vec(work->pol->Ared,pcVar15,pcVar16 + work->data->n,-1);
            (*pLVar11->solve)(pLVar11,pcVar16);
            if (0 < lVar20) {
              lVar17 = 0;
              do {
                pcVar15[lVar17] = pcVar16[lVar17] + pcVar15[lVar17];
                lVar17 = lVar17 + 1;
              } while (lVar20 != lVar17);
            }
            lVar21 = lVar21 + 1;
          } while (lVar21 < work->settings->polish_refine_iter);
          free(pcVar16);
          goto LAB_001aff53;
        }
        cVar13 = _osqp_error(OSQP_MEM_ALLOC_ERROR,"iterative_refinement");
        if (cVar13 == 0) goto LAB_001aff53;
        work->info->status_polish = -1;
        csc_spfree(work->pol->Ared);
        free(pcVar14);
        pcVar14 = pcVar15;
      }
      free(pcVar14);
    }
  }
  return -1;
}

Assistant:

c_int polish(OSQPWorkspace *work) {
  c_int mred, polish_successful, exitflag;
  c_float *rhs_red;
  LinSysSolver *plsh;
  c_float *pol_sol; // Polished solution

#ifdef PROFILING
  osqp_tic(work->timer); // Start timer
#endif /* ifdef PROFILING */

  // Form Ared by assuming the active constraints and store in work->pol->Ared
  mred = form_Ared(work);
  if (mred < 0) { // work->pol->red = OSQP_NULL
    // Polishing failed
    work->info->status_polish = -1;

    return -1;
  }

  // Form and factorize reduced KKT
  exitflag = init_linsys_solver(&plsh, work->data->P, work->pol->Ared,
                                work->settings->delta, OSQP_NULL,
                                work->settings->linsys_solver, 1);

  if (exitflag) {
    // Polishing failed
    work->info->status_polish = -1;

    // Memory clean-up
    if (work->pol->Ared) csc_spfree(work->pol->Ared);

    return 1;
  }

  // Form reduced right-hand side rhs_red
  rhs_red = c_malloc(sizeof(c_float) * (work->data->n + mred));
  if (!rhs_red) {
    // Polishing failed
    work->info->status_polish = -1;

    // Memory clean-up
    csc_spfree(work->pol->Ared);

    return -1;
  }
  form_rhs_red(work, rhs_red);

  pol_sol = vec_copy(rhs_red, work->data->n + mred);
  if (!pol_sol) {
    // Polishing failed
    work->info->status_polish = -1;

    // Memory clean-up
    csc_spfree(work->pol->Ared);
    c_free(rhs_red);
  
    return -1;
  }

  // Solve the reduced KKT system
  plsh->solve(plsh, pol_sol);

  // Perform iterative refinement to compensate for the regularization error
  exitflag = iterative_refinement(work, plsh, pol_sol, rhs_red);

  if (exitflag) {
    // Polishing failed
    work->info->status_polish = -1;

    // Memory clean-up
    csc_spfree(work->pol->Ared);
    c_free(rhs_red);
    c_free(pol_sol);
  
    return -1;
  }

  // Store the polished solution (x,z,y)
  prea_vec_copy(pol_sol, work->pol->x, work->data->n);   // pol->x
  mat_vec(work->data->A, work->pol->x, work->pol->z, 0); // pol->z
  get_ypol_from_yred(work, pol_sol + work->data->n);     // pol->y

  // Ensure (z,y) satisfies normal cone constraint
  project_normalcone(work, work->pol->z, work->pol->y);

  // Compute primal and dual residuals at the polished solution
  update_info(work, 0, 1, 1);

  // Check if polish was successful
  polish_successful = (work->pol->pri_res < work->info->pri_res &&
                       work->pol->dua_res < work->info->dua_res) || // Residuals
                                                                    // are
                                                                    // reduced
                      (work->pol->pri_res < work->info->pri_res &&
                       work->info->dua_res < 1e-10) ||              // Dual
                                                                    // residual
                                                                    // already
                                                                    // tiny
                      (work->pol->dua_res < work->info->dua_res &&
                       work->info->pri_res < 1e-10);                // Primal
                                                                    // residual
                                                                    // already
                                                                    // tiny

  if (polish_successful) {
    // Update solver information
    work->info->obj_val       = work->pol->obj_val;
    work->info->pri_res       = work->pol->pri_res;
    work->info->dua_res       = work->pol->dua_res;
    work->info->status_polish = 1;

    // Update (x, z, y) in ADMM iterations
    // NB: z needed for warm starting
    prea_vec_copy(work->pol->x, work->x, work->data->n);
    prea_vec_copy(work->pol->z, work->z, work->data->m);
    prea_vec_copy(work->pol->y, work->y, work->data->m);

    // Print summary
#ifdef PRINTING

    if (work->settings->verbose) print_polish(work);
#endif /* ifdef PRINTING */
  } else { // Polishing failed
    work->info->status_polish = -1;

    // TODO: Try to find a better solution on the line connecting ADMM
    //       and polished solution
  }

  // Memory clean-up
  plsh->free(plsh);

  // Checks that they are not NULL are already performed earlier
  csc_spfree(work->pol->Ared);
  c_free(rhs_red);
  c_free(pol_sol);

  return 0;
}